

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteCustomTargetBOD(cmGlobalGhsMultiGenerator *this,ostream *fout)

{
  std::operator<<(fout,
                  "FileTypes {\n  CmakeTarget {\n    name = \"Custom Target\"\n    action = \"&Execute\"\n    grepable = false\n    outputType = \"None\"\n    color = \"#800080\"\n  }\n}\n"
                 );
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteCustomTargetBOD(std::ostream& fout)
{
  fout << "FileTypes {\n"
          "  CmakeTarget {\n"
          "    name = \"Custom Target\"\n"
          "    action = \"&Execute\"\n"
          "    grepable = false\n"
          "    outputType = \"None\"\n"
          "    color = \"#800080\"\n"
          "  }\n"
          "}\n";
}